

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

cmValue __thiscall cmStateDirectory::GetProperty(cmStateDirectory *this,string *prop,bool chain)

{
  PositionType *this_00;
  bool bVar1;
  __type _Var2;
  int iVar3;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *this_01;
  size_type __n;
  string *psVar4;
  PointerType pBVar5;
  cmStateDirectory local_4c8;
  undefined1 local_4a0 [8];
  cmStateSnapshot parentSnapshot;
  cmValue retVal;
  cmBTStringRange local_470;
  string local_460;
  string_view local_440;
  cmBTStringRange local_430;
  string local_420;
  string_view local_400;
  cmBTStringRange local_3f0;
  string local_3e0;
  string_view local_3c0;
  cmBTStringRange local_3b0;
  string local_3a0;
  string_view local_380;
  cmBTStringRange local_370;
  string local_360;
  string_view local_340;
  string_view local_330;
  string local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f0;
  undefined1 local_2d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  string_view local_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  string local_288;
  string_view local_268;
  string_view local_258;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_220;
  cmStateSnapshot local_218;
  undefined1 local_200 [8];
  cmStateSnapshot snp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listFiles;
  string_view local_1c0;
  string local_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  size_t local_180;
  char *local_178;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_170;
  string_view local_160;
  string_view local_150;
  string local_140;
  string_view local_120;
  string_view local_110;
  string local_100;
  cmStateDirectory local_e0;
  reference local_b8;
  cmStateSnapshot *ci;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *__range2;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *children;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  child_dirs;
  undefined1 local_40 [8];
  cmStateSnapshot parent;
  bool chain_local;
  string *prop_local;
  cmStateDirectory *this_local;
  
  parent.Position.Position._7_1_ = chain;
  if (GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    }
  }
  std::__cxx11::string::clear();
  bVar1 = std::operator==(prop,"PARENT_DIRECTORY");
  if (bVar1) {
    cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)local_40,&this->Snapshot_);
    bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_40);
    if (bVar1) {
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)
                 &child_dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(cmStateSnapshot *)local_40);
      psVar4 = GetCurrentSource_abi_cxx11_
                         ((cmStateDirectory *)
                          &child_dirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmValue::cmValue((cmValue *)&this_local,psVar4);
    }
    else {
      cmValue::cmValue((cmValue *)&this_local,
                       &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    }
  }
  else {
    _Var2 = std::operator==(prop,&kBINARY_DIR_abi_cxx11_);
    if (_Var2) {
      psVar4 = GetCurrentBinary_abi_cxx11_(this);
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                 (string *)psVar4);
      cmValue::cmValue((cmValue *)&this_local,
                       &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    }
    else {
      _Var2 = std::operator==(prop,&kSOURCE_DIR_abi_cxx11_);
      if (_Var2) {
        psVar4 = GetCurrentSource_abi_cxx11_(this);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   (string *)psVar4);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
      }
      else {
        _Var2 = std::operator==(prop,&kSUBDIRECTORIES_abi_cxx11_);
        if (_Var2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&children);
          pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                             (&this->DirectoryState);
          this_01 = &pBVar5->Children;
          __n = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::size(this_01);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&children,__n);
          __end2 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin(this_01);
          ci = (cmStateSnapshot *)
               std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end(this_01);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              (&__end2,(__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                                        *)&ci);
            if (!bVar1) break;
            local_b8 = __gnu_cxx::
                       __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                       ::operator*(&__end2);
            cmStateSnapshot::GetDirectory(&local_e0,local_b8);
            psVar4 = GetCurrentSource_abi_cxx11_(&local_e0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&children,psVar4);
            __gnu_cxx::
            __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
            ::operator++(&__end2);
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_110,";");
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_120);
          cmJoin(&local_100,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&children,local_110,local_120);
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                     (string *)&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          cmValue::cmValue((cmValue *)&this_local,
                           &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&children);
        }
        else {
          _Var2 = std::operator==(prop,&kBUILDSYSTEM_TARGETS_abi_cxx11_);
          if (_Var2) {
            pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                     operator->(&this->DirectoryState);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_150,";")
            ;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_160);
            cmJoin(&local_140,&pBVar5->NormalTargetNames,local_150,local_160);
            std::__cxx11::string::operator=
                      ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                       (string *)&local_140);
            std::__cxx11::string::~string((string *)&local_140);
            cmValue::cmValue((cmValue *)&this_local,
                             &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
          }
          else {
            local_170 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                        std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
            local_190 = (basic_string_view<char,_std::char_traits<char>_>)
                        ::cm::operator____s("IMPORTED_TARGETS",0x10);
            local_180 = local_190._M_len;
            local_178 = local_190._M_str;
            bVar1 = std::operator==(local_170,local_190);
            if (bVar1) {
              pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                       operator->(&this->DirectoryState);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_1c0,";");
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &listFiles.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              cmJoin(&local_1b0,&pBVar5->ImportedTargetNames,local_1c0,stack0xfffffffffffffe30);
              std::__cxx11::string::operator=
                        ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_
                         ,(string *)&local_1b0);
              std::__cxx11::string::~string((string *)&local_1b0);
              cmValue::cmValue((cmValue *)&this_local,
                               &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
            }
            else {
              bVar1 = std::operator==(prop,"LISTFILE_STACK");
              if (bVar1) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&snp.Position.Position);
                local_200 = (undefined1  [8])(this->Snapshot_).State;
                snp.State = (cmState *)(this->Snapshot_).Position.Tree;
                snp.Position.Tree =
                     (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
                     (this->Snapshot_).Position.Position;
                while( true ) {
                  bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_200);
                  if (!bVar1) break;
                  psVar4 = cmStateSnapshot::GetExecutionListFile_abi_cxx11_
                                     ((cmStateSnapshot *)local_200);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&snp.Position.Position,psVar4);
                  cmStateSnapshot::GetCallStackParent(&local_218,(cmStateSnapshot *)local_200);
                  local_200 = (undefined1  [8])local_218.State;
                  snp.State = (cmState *)local_218.Position.Tree;
                  snp.Position.Tree =
                       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_218.Position.Position;
                }
                this_00 = &snp.Position.Position;
                local_220._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this_00);
                local_228 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)this_00);
                std::
                reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (local_220,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_228);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_258,";");
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_268)
                ;
                cmJoin(&local_248,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&snp.Position.Position,local_258,local_268);
                std::__cxx11::string::operator=
                          ((string *)
                           &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                           (string *)&local_248);
                std::__cxx11::string::~string((string *)&local_248);
                cmValue::cmValue((cmValue *)&this_local,
                                 &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&snp.Position.Position);
              }
              else {
                bVar1 = std::operator==(prop,"CACHE_VARIABLES");
                if (bVar1) {
                  cmState::GetCacheEntryKeys_abi_cxx11_(&local_2a0,(this->Snapshot_).State);
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_2b0,";");
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &res.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  cmJoin(&local_288,&local_2a0,local_2b0,stack0xfffffffffffffd40);
                  std::__cxx11::string::operator=
                            ((string *)
                             &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                             (string *)&local_288);
                  std::__cxx11::string::~string((string *)&local_288);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_2a0);
                  cmValue::cmValue((cmValue *)&this_local,
                                   &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_
                                  );
                }
                else {
                  bVar1 = std::operator==(prop,"VARIABLES");
                  if (bVar1) {
                    cmStateSnapshot::ClosureKeys_abi_cxx11_
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2d8,&this->Snapshot_);
                    cmState::GetCacheEntryKeys_abi_cxx11_(&local_2f0,(this->Snapshot_).State);
                    ::cm::
                    append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2d8,&local_2f0);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_2f0);
                    local_2f8._M_current =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_2d8);
                    local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_2d8);
                    std::
                    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              (local_2f8,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                )local_300);
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_330,";");
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_340);
                    cmJoin(&local_320,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2d8,local_330,local_340);
                    std::__cxx11::string::operator=
                              ((string *)
                               &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                               (string *)&local_320);
                    std::__cxx11::string::~string((string *)&local_320);
                    cmValue::cmValue((cmValue *)&this_local,
                                     &GetProperty(std::__cxx11::string_const&,bool)::
                                      output_abi_cxx11_);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_2d8);
                  }
                  else {
                    bVar1 = std::operator==(prop,"INCLUDE_DIRECTORIES");
                    if (bVar1) {
                      local_370 = GetIncludeDirectoriesEntries_abi_cxx11_(this);
                      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                (&local_380,";");
                      cmJoin<cmRange<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
                                (&local_360,&local_370,local_380);
                      std::__cxx11::string::operator=
                                ((string *)
                                 &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                                 (string *)&local_360);
                      std::__cxx11::string::~string((string *)&local_360);
                      cmValue::cmValue((cmValue *)&this_local,
                                       &GetProperty(std::__cxx11::string_const&,bool)::
                                        output_abi_cxx11_);
                    }
                    else {
                      bVar1 = std::operator==(prop,"COMPILE_OPTIONS");
                      if (bVar1) {
                        local_3b0 = GetCompileOptionsEntries_abi_cxx11_(this);
                        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                  (&local_3c0,";");
                        cmJoin<cmRange<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
                                  (&local_3a0,&local_3b0,local_3c0);
                        std::__cxx11::string::operator=
                                  ((string *)
                                   &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_
                                   ,(string *)&local_3a0);
                        std::__cxx11::string::~string((string *)&local_3a0);
                        cmValue::cmValue((cmValue *)&this_local,
                                         &GetProperty(std::__cxx11::string_const&,bool)::
                                          output_abi_cxx11_);
                      }
                      else {
                        bVar1 = std::operator==(prop,"COMPILE_DEFINITIONS");
                        if (bVar1) {
                          local_3f0 = GetCompileDefinitionsEntries_abi_cxx11_(this);
                          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                    (&local_400,";");
                          cmJoin<cmRange<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
                                    (&local_3e0,&local_3f0,local_400);
                          std::__cxx11::string::operator=
                                    ((string *)
                                     &GetProperty(std::__cxx11::string_const&,bool)::
                                      output_abi_cxx11_,(string *)&local_3e0);
                          std::__cxx11::string::~string((string *)&local_3e0);
                          cmValue::cmValue((cmValue *)&this_local,
                                           &GetProperty(std::__cxx11::string_const&,bool)::
                                            output_abi_cxx11_);
                        }
                        else {
                          bVar1 = std::operator==(prop,"LINK_OPTIONS");
                          if (bVar1) {
                            local_430 = GetLinkOptionsEntries_abi_cxx11_(this);
                            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                      (&local_440,";");
                            cmJoin<cmRange<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
                                      (&local_420,&local_430,local_440);
                            std::__cxx11::string::operator=
                                      ((string *)
                                       &GetProperty(std::__cxx11::string_const&,bool)::
                                        output_abi_cxx11_,(string *)&local_420);
                            std::__cxx11::string::~string((string *)&local_420);
                            cmValue::cmValue((cmValue *)&this_local,
                                             &GetProperty(std::__cxx11::string_const&,bool)::
                                              output_abi_cxx11_);
                          }
                          else {
                            bVar1 = std::operator==(prop,"LINK_DIRECTORIES");
                            if (bVar1) {
                              local_470 = GetLinkDirectoriesEntries_abi_cxx11_(this);
                              std::basic_string_view<char,_std::char_traits<char>_>::
                              basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)
                                                &retVal,";");
                              cmJoin<cmRange<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
                                        (&local_460,&local_470,_retVal);
                              std::__cxx11::string::operator=
                                        ((string *)
                                         &GetProperty(std::__cxx11::string_const&,bool)::
                                          output_abi_cxx11_,(string *)&local_460);
                              std::__cxx11::string::~string((string *)&local_460);
                              cmValue::cmValue((cmValue *)&this_local,
                                               &GetProperty(std::__cxx11::string_const&,bool)::
                                                output_abi_cxx11_);
                            }
                            else {
                              pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::
                                       iterator::operator->(&this->DirectoryState);
                              parentSnapshot.Position.Position =
                                   (PositionType)
                                   cmPropertyMap::GetPropertyValue(&pBVar5->Properties,prop);
                              bVar1 = cmValue::operator_cast_to_bool
                                                ((cmValue *)&parentSnapshot.Position.Position);
                              if ((bVar1) || ((parent.Position.Position._7_1_ & 1) == 0)) {
                                this_local = (cmStateDirectory *)parentSnapshot.Position.Position;
                              }
                              else {
                                cmStateSnapshot::GetBuildsystemDirectoryParent
                                          ((cmStateSnapshot *)local_4a0,&this->Snapshot_);
                                bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_4a0);
                                if (bVar1) {
                                  cmStateSnapshot::GetDirectory
                                            (&local_4c8,(cmStateSnapshot *)local_4a0);
                                  this_local = (cmStateDirectory *)
                                               GetProperty(&local_4c8,prop,
                                                           (bool)(parent.Position.Position._7_1_ & 1
                                                                 ));
                                }
                                else {
                                  this_local = (cmStateDirectory *)
                                               cmState::GetGlobalProperty
                                                         ((this->Snapshot_).State,prop);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (cmValue)(string *)this_local;
}

Assistant:

cmValue cmStateDirectory::GetProperty(const std::string& prop,
                                      bool chain) const
{
  static std::string output;
  output.clear();
  if (prop == "PARENT_DIRECTORY") {
    cmStateSnapshot parent = this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parent.IsValid()) {
      return cmValue(parent.GetDirectory().GetCurrentSource());
    }
    return cmValue(output);
  }
  if (prop == kBINARY_DIR) {
    output = this->GetCurrentBinary();
    return cmValue(output);
  }
  if (prop == kSOURCE_DIR) {
    output = this->GetCurrentSource();
    return cmValue(output);
  }
  if (prop == kSUBDIRECTORIES) {
    std::vector<std::string> child_dirs;
    std::vector<cmStateSnapshot> const& children =
      this->DirectoryState->Children;
    child_dirs.reserve(children.size());
    for (cmStateSnapshot const& ci : children) {
      child_dirs.push_back(ci.GetDirectory().GetCurrentSource());
    }
    output = cmJoin(child_dirs, ";");
    return cmValue(output);
  }
  if (prop == kBUILDSYSTEM_TARGETS) {
    output = cmJoin(this->DirectoryState->NormalTargetNames, ";");
    return cmValue(output);
  }
  if (prop == "IMPORTED_TARGETS"_s) {
    output = cmJoin(this->DirectoryState->ImportedTargetNames, ";");
    return cmValue(output);
  }

  if (prop == "LISTFILE_STACK") {
    std::vector<std::string> listFiles;
    cmStateSnapshot snp = this->Snapshot_;
    while (snp.IsValid()) {
      listFiles.push_back(snp.GetExecutionListFile());
      snp = snp.GetCallStackParent();
    }
    std::reverse(listFiles.begin(), listFiles.end());
    output = cmJoin(listFiles, ";");
    return cmValue(output);
  }
  if (prop == "CACHE_VARIABLES") {
    output = cmJoin(this->Snapshot_.State->GetCacheEntryKeys(), ";");
    return cmValue(output);
  }
  if (prop == "VARIABLES") {
    std::vector<std::string> res = this->Snapshot_.ClosureKeys();
    cm::append(res, this->Snapshot_.State->GetCacheEntryKeys());
    std::sort(res.begin(), res.end());
    output = cmJoin(res, ";");
    return cmValue(output);
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    output = cmJoin(this->GetIncludeDirectoriesEntries(), ";");
    return cmValue(output);
  }
  if (prop == "COMPILE_OPTIONS") {
    output = cmJoin(this->GetCompileOptionsEntries(), ";");
    return cmValue(output);
  }
  if (prop == "COMPILE_DEFINITIONS") {
    output = cmJoin(this->GetCompileDefinitionsEntries(), ";");
    return cmValue(output);
  }
  if (prop == "LINK_OPTIONS") {
    output = cmJoin(this->GetLinkOptionsEntries(), ";");
    return cmValue(output);
  }
  if (prop == "LINK_DIRECTORIES") {
    output = cmJoin(this->GetLinkDirectoriesEntries(), ";");
    return cmValue(output);
  }

  cmValue retVal = this->DirectoryState->Properties.GetPropertyValue(prop);
  if (!retVal && chain) {
    cmStateSnapshot parentSnapshot =
      this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parentSnapshot.IsValid()) {
      return parentSnapshot.GetDirectory().GetProperty(prop, chain);
    }
    return this->Snapshot_.State->GetGlobalProperty(prop);
  }

  return retVal;
}